

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9QVar(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Gia_Man_t *pNew;
  char *pcVar3;
  uint local_40;
  int fVerbose;
  int fQuantE;
  int fQuantU;
  int nPars;
  int c;
  Gia_Man_t *pTemp;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  fQuantE = -1;
  fVerbose = 0;
  local_40 = 0;
  bVar1 = false;
  Extra_UtilGetoptReset();
  do {
    iVar2 = Extra_UtilGetopt(argc,argv,"Puevh");
    if (iVar2 == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"There is no current GIA.\n");
        return 1;
      }
      iVar2 = Gia_ManRegNum(pAbc->pGia);
      if (iVar2 != 0) {
        Abc_Print(-1,"Works only for combinational networks.\n");
        return 1;
      }
      if ((0 < fQuantE) && (iVar2 = Gia_ManPiNum(pAbc->pGia), fQuantE < iVar2)) {
        pNew = Gia_QbfQuantifyAll(pAbc->pGia,fQuantE,fVerbose,local_40);
        Abc_FrameUpdateGia(pAbc,pNew);
        return 0;
      }
      Abc_Print(-1,"The number of parameter variables is invalid (should be > 0 and < PI num).\n");
      return 1;
    }
    switch(iVar2) {
    case 0x50:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-P\" should be followed by an integer.\n");
        goto LAB_002beefb;
      }
      fQuantE = atoi(argv[globalUtilOptind]);
      globalUtilOptind = globalUtilOptind + 1;
      if (fQuantE < 0) {
LAB_002beefb:
        Abc_Print(-2,"usage: &qvar [-P num] [-uevh]\n");
        Abc_Print(-2,"\t         derives cofactors w.r.t. the last NumPi-<num> variables\n");
        Abc_Print(-2,"\t-P num : number of parameters p (should be the first PIs) [default = %d]\n",
                  (ulong)(uint)fQuantE);
        pcVar3 = "no";
        if (fVerbose != 0) {
          pcVar3 = "yes";
        }
        Abc_Print(-2,
                  "\t-u     : toggle ANDing cofactors (universal quantification) [default = %s]\n",
                  pcVar3);
        pcVar3 = "no";
        if (local_40 != 0) {
          pcVar3 = "yes";
        }
        Abc_Print(-2,
                  "\t-e     : toggle ORing cofactors (existential quantification) [default = %s]\n",
                  pcVar3);
        pcVar3 = "no";
        if (bVar1) {
          pcVar3 = "yes";
        }
        Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar3);
        Abc_Print(-2,"\t-h     : print the command usage\n");
        return 1;
      }
      break;
    default:
      goto LAB_002beefb;
    case 0x65:
      local_40 = local_40 ^ 1;
      break;
    case 0x68:
      goto LAB_002beefb;
    case 0x75:
      fVerbose = fVerbose ^ 1;
      break;
    case 0x76:
      bVar1 = (bool)(bVar1 ^ 1);
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9QVar( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Gia_QbfQuantifyAll( Gia_Man_t * p, int nPars, int fAndAll, int fOrAll );
    Gia_Man_t * pTemp;
    int c, nPars   = -1;
    int fQuantU    =  0;
    int fQuantE    =  0;
    int fVerbose   =  0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Puevh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            nPars = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nPars < 0 )
                goto usage;
            break;
        case 'u':
            fQuantU ^= 1;
            break;
        case 'e':
            fQuantE ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "There is no current GIA.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) )
    {
        Abc_Print( -1, "Works only for combinational networks.\n" );
        return 1;
    }
    if ( !(nPars > 0 && nPars < Gia_ManPiNum(pAbc->pGia)) )
    {
        Abc_Print( -1, "The number of parameter variables is invalid (should be > 0 and < PI num).\n" );
        return 1;
    }
    pTemp = Gia_QbfQuantifyAll( pAbc->pGia, nPars, fQuantU, fQuantE );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &qvar [-P num] [-uevh]\n" );
    Abc_Print( -2, "\t         derives cofactors w.r.t. the last NumPi-<num> variables\n" );
    Abc_Print( -2, "\t-P num : number of parameters p (should be the first PIs) [default = %d]\n", nPars );
    Abc_Print( -2, "\t-u     : toggle ANDing cofactors (universal quantification) [default = %s]\n", fQuantU? "yes": "no" );
    Abc_Print( -2, "\t-e     : toggle ORing cofactors (existential quantification) [default = %s]\n", fQuantE? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}